

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inspect.c
# Opt level: O1

void duckdb_je_inspect_extent_util_stats_get
               (tsdn_t *tsdn,void *ptr,size_t *nfree,size_t *nregs,size_t *size)

{
  rtree_ctx_cache_elm_t *prVar1;
  void *pvVar2;
  rtree_leaf_elm_t *prVar3;
  ulong *puVar4;
  ulong uVar5;
  void *pvVar6;
  rtree_ctx_t *ctx;
  ulong uVar7;
  rtree_ctx_cache_elm_t *prVar8;
  rtree_ctx_cache_elm_t *prVar9;
  rtree_leaf_elm_t *prVar10;
  bool bVar11;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_ctx_t local_1b0;
  
  if (tsdn == (tsdn_t *)0x0) {
    ctx = &local_1b0;
    duckdb_je_rtree_ctx_data_init(ctx);
  }
  else {
    ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  pvVar6 = (void *)((ulong)ptr & 0xffffffffc0000000);
  uVar5 = (ulong)(((uint)((ulong)ptr >> 0x1e) & 0xf) << 4);
  prVar10 = (rtree_leaf_elm_t *)((long)&ctx->cache[0].leafkey + uVar5);
  pvVar2 = *(void **)((long)&ctx->cache[0].leafkey + uVar5);
  if (pvVar2 == pvVar6) {
    prVar10 = (rtree_leaf_elm_t *)
              ((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + (long)prVar10[1].le_bits.repr);
  }
  else if ((void *)ctx->l2_cache[0].leafkey == pvVar6) {
    prVar3 = ctx->l2_cache[0].leaf;
    ctx->l2_cache[0].leafkey = (uintptr_t)pvVar2;
    ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)prVar10[1].le_bits.repr;
    (prVar10->le_bits).repr = pvVar6;
    prVar10[1].le_bits.repr = prVar3;
    prVar10 = (rtree_leaf_elm_t *)
              ((long)&(prVar3->le_bits).repr + (ulong)((uint)ptr >> 9 & 0x1ffff8));
  }
  else {
    prVar8 = ctx->l2_cache + 1;
    if ((void *)ctx->l2_cache[1].leafkey == pvVar6) {
      uVar7 = 0;
      bVar11 = false;
    }
    else {
      uVar5 = 1;
      prVar9 = prVar8;
      do {
        uVar7 = uVar5;
        bVar11 = 6 < uVar7;
        if (uVar7 == 7) goto LAB_01db35ef;
        prVar8 = prVar9 + 1;
        prVar1 = prVar9 + 1;
        uVar5 = uVar7 + 1;
        prVar9 = prVar8;
      } while ((void *)prVar1->leafkey != pvVar6);
      bVar11 = 6 < uVar7;
    }
    prVar3 = prVar8->leaf;
    prVar8->leafkey = ctx->l2_cache[uVar7].leafkey;
    prVar8->leaf = ctx->l2_cache[uVar7].leaf;
    ctx->l2_cache[uVar7].leafkey = (uintptr_t)pvVar2;
    ctx->l2_cache[uVar7].leaf = (rtree_leaf_elm_t *)prVar10[1].le_bits.repr;
    (prVar10->le_bits).repr = pvVar6;
    prVar10[1].le_bits.repr = prVar3;
    prVar10 = (rtree_leaf_elm_t *)
              ((long)&(prVar3->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
LAB_01db35ef:
    if (bVar11) {
      prVar10 = duckdb_je_rtree_leaf_elm_lookup_hard
                          (tsdn,&duckdb_je_arena_emap_global.rtree,ctx,(uintptr_t)ptr,true,false);
    }
  }
  puVar4 = (ulong *)(((long)(prVar10->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80);
  if (puVar4 == (ulong *)0x0) {
    *size = 0;
    *nregs = 0;
    *nfree = 0;
  }
  else {
    *size = puVar4[2] & 0xfffffffffffff000;
    if (((uint)*puVar4 >> 0xc & 1) == 0) {
      *nfree = 0;
      uVar5 = 1;
    }
    else {
      *nfree = (ulong)((uint)(*puVar4 >> 0x1c) & 0x3ff);
      uVar5 = (ulong)duckdb_je_bin_infos[(uint)*puVar4 >> 0x14 & 0xff].nregs;
    }
    *nregs = uVar5;
  }
  return;
}

Assistant:

void
inspect_extent_util_stats_get(tsdn_t *tsdn, const void *ptr, size_t *nfree,
    size_t *nregs, size_t *size) {
	assert(ptr != NULL && nfree != NULL && nregs != NULL && size != NULL);

	const edata_t *edata = emap_edata_lookup(tsdn, &arena_emap_global, ptr);
	if (unlikely(edata == NULL)) {
		*nfree = *nregs = *size = 0;
		return;
	}

	*size = edata_size_get(edata);
	if (!edata_slab_get(edata)) {
		*nfree = 0;
		*nregs = 1;
	} else {
		*nfree = edata_nfree_get(edata);
		*nregs = bin_infos[edata_szind_get(edata)].nregs;
		assert(*nfree <= *nregs);
		assert(*nfree * edata_usize_get(edata) <= *size);
	}
}